

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::Value> * __thiscall
tinyusdz::XformOp::get_scalar
          (optional<tinyusdz::value::Value> *__return_storage_ptr__,XformOp *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if (((this->_var)._blocked == false) &&
     (((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 0)) ||
      ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = true;
  pvVar1 = (this->_var)._value.v_.vtable;
  *(vtable_type **)((long)&__return_storage_ptr__->contained + 0x10) = pvVar1;
  if (pvVar1 != (vtable_type *)0x0) {
    (*pvVar1->copy)((storage_union *)&this->_var,(storage_union *)&__return_storage_ptr__->contained
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<value::Value> get_scalar() const {
    if (has_default()) {
      return _var.value_raw();
    }
    return nonstd::nullopt;
  }